

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

Result<std::shared_ptr<const_CTransaction>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::createTransaction
          (Result<std::shared_ptr<const_CTransaction>_> *__return_storage_ptr__,WalletImpl *this,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
          CCoinControl *coin_control,bool sign,int *change_pos,CAmount *fee)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  T *pTVar6;
  _Storage<unsigned_int,_true> _Var7;
  optional<unsigned_int> change_pos_00;
  long in_FS_OFFSET;
  Result<wallet::CreatedTransactionResult> res;
  unique_lock<std::recursive_mutex> local_130;
  bilingual_str local_120;
  _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> local_e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_130._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_130._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_130);
  change_pos_00.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = *change_pos != -1;
  change_pos_00.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = *change_pos;
  change_pos_00.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._5_3_ = 0;
  CreateTransaction((Result<wallet::CreatedTransactionResult> *)&local_e0,
                    (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                            recipients,change_pos_00,coin_control,sign);
  if (local_e0._M_index == '\x01') {
    pTVar6 = util::Result<wallet::CreatedTransactionResult>::value
                       ((Result<wallet::CreatedTransactionResult> *)&local_e0);
    *fee = pTVar6->fee;
    _Var7._M_value = 0xffffffff;
    if ((pTVar6->change_pos).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged != false) {
      _Var7 = (pTVar6->change_pos).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload;
    }
    *change_pos = (int)_Var7;
    peVar4 = (pTVar6->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var5 = (pTVar6->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    *(element_type **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> = peVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> + 8)
         = p_Var5;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
     0x40) = '\x01';
  }
  else {
    util::ErrorString<wallet::CreatedTransactionResult>
              (&local_120,(Result<wallet::CreatedTransactionResult> *)&local_e0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
      super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> = puVar1;
    paVar2 = &local_120.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.original._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_120.original.field_2._M_allocated_capacity._1_7_,
                         local_120.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
       0x18) = local_120.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
        super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
        super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
        super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
        super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
        super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> =
           local_120.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                        super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                + 0x10) =
           CONCAT71(local_120.original.field_2._M_allocated_capacity._1_7_,
                    local_120.original.field_2._M_local_buf[0]);
    }
    paVar3 = &local_120.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> + 8)
         = local_120.original._M_string_length;
    local_120.original._M_string_length = 0;
    local_120.original.field_2._M_local_buf[0] = '\0';
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                     super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
             + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
     0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.translated._M_dataplus._M_p == paVar3) {
      *puVar1 = CONCAT71(local_120.translated.field_2._M_allocated_capacity._1_7_,
                         local_120.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
       0x38) = local_120.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
               super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
       0x20) = local_120.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
                        super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>
                + 0x30) =
           CONCAT71(local_120.translated.field_2._M_allocated_capacity._1_7_,
                    local_120.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
     0x28) = local_120.translated._M_string_length;
    local_120.translated._M_string_length = 0;
    local_120.translated.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_assign_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Move_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Copy_ctor_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_>.
             super__Variant_storage_alias<bilingual_str,_std::shared_ptr<const_CTransaction>_> +
     0x40) = '\0';
    local_120.original._M_dataplus._M_p = (pointer)paVar2;
    local_120.translated._M_dataplus._M_p = (pointer)paVar3;
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage(&local_e0);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CTransactionRef> createTransaction(const std::vector<CRecipient>& recipients,
        const CCoinControl& coin_control,
        bool sign,
        int& change_pos,
        CAmount& fee) override
    {
        LOCK(m_wallet->cs_wallet);
        auto res = CreateTransaction(*m_wallet, recipients, change_pos == -1 ? std::nullopt : std::make_optional(change_pos),
                                     coin_control, sign);
        if (!res) return util::Error{util::ErrorString(res)};
        const auto& txr = *res;
        fee = txr.fee;
        change_pos = txr.change_pos ? int(*txr.change_pos) : -1;

        return txr.tx;
    }